

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpselect.h
# Opt level: O3

int jrtplib::RTPSelect(SocketType *sockets,int8_t *readflags,size_t numsocks,RTPTime timeout)

{
  size_t i;
  size_t sVar1;
  int iVar2;
  double dVar3;
  vector<pollfd,_std::allocator<pollfd>_> fds;
  allocator_type local_41;
  vector<pollfd,_std::allocator<pollfd>_> local_40;
  double local_28;
  
  local_28 = timeout.m_t;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&local_40,numsocks,&local_41);
  if (numsocks != 0) {
    sVar1 = 0;
    do {
      ((pollfd *)
      (local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
       _M_start + sVar1))->fd = sockets[sVar1];
      ((pollfd *)
      (local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
       _M_start + sVar1))->events = 1;
      ((pollfd *)
      (local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
       _M_start + sVar1))->revents = 0;
      readflags[sVar1] = '\0';
      sVar1 = sVar1 + 1;
    } while (numsocks != sVar1);
  }
  iVar2 = -1;
  if (0.0 <= local_28) {
    dVar3 = 2147483647.0;
    if (local_28 * 1000.0 <= 2147483647.0) {
      dVar3 = local_28 * 1000.0;
    }
    iVar2 = (int)dVar3;
  }
  iVar2 = poll((pollfd *)
               local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,numsocks,iVar2);
  if (iVar2 < 0) {
    iVar2 = -0xb4;
  }
  else if (iVar2 != 0 && numsocks != 0) {
    sVar1 = 0;
    do {
      if (((pollfd *)
          (local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start + sVar1))->revents != 0) {
        readflags[sVar1] = '\x01';
      }
      sVar1 = sVar1 + 1;
    } while (numsocks != sVar1);
  }
  if (local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

inline int RTPSelect(const SocketType *sockets, int8_t *readflags, size_t numsocks, RTPTime timeout)
{
	using namespace std;

	vector<struct pollfd> fds(numsocks);

	for (size_t i = 0 ; i < numsocks ; i++)
	{
		fds[i].fd = sockets[i];
		fds[i].events = POLLIN;
		fds[i].revents = 0;
		readflags[i] = 0;
	}

	int timeoutmsec = -1;
	if (timeout.GetDouble() >= 0)
	{
		double dtimeoutmsec = timeout.GetDouble()*1000.0;
		if (dtimeoutmsec > (numeric_limits<int>::max)()) // parentheses to prevent windows 'max' macro expansion
			dtimeoutmsec = (numeric_limits<int>::max)();
		
		timeoutmsec = (int)dtimeoutmsec;
	}

#ifdef RTP_HAVE_WSAPOLL
	int status = WSAPoll(&(fds[0]), (ULONG)numsocks, timeoutmsec);
#else
	int status = poll(&(fds[0]), numsocks, timeoutmsec);
#endif // RTP_HAVE_WSAPOLL
	if (status < 0)
		return ERR_RTP_SELECT_ERRORINPOLL;

	if (status > 0)
	{
		for (size_t i = 0 ; i < numsocks ; i++)
		{
			if (fds[i].revents)
				readflags[i] = 1;
		}
	}
	return status;
}